

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,long right,ValidityMask *mask,
                   idx_t idx)

{
  bool bVar1;
  ulong uVar2;
  OutOfRangeException *this;
  idx_t len;
  undefined1 *__dest;
  uint64_t right_00;
  long lVar3;
  void *__src;
  bool bVar4;
  string_t result_str;
  idx_t copy_size;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Vector *local_48;
  undefined8 local_40;
  void *local_38;
  
  local_68._8_8_ = local_68._0_8_;
  local_38 = left.value._8_8_;
  local_40 = left.value._0_8_;
  uVar2 = local_40 & 0xffffffff;
  bVar4 = ((undefined1  [16])left.value & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0;
  __src = local_38;
  if (uVar2 < 0xd) {
    __src = (void *)((long)&local_40 + 4);
  }
  right_00 = 0;
  if (0 < right && bVar4) {
    right_00 = right;
  }
  bVar1 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (uVar2,right_00,(uint64_t *)&local_48);
  if (bVar1) {
    local_68 = (undefined1  [16])StringVector::EmptyString((StringVector *)fun.result,local_48,len);
    __dest = local_68._8_8_;
    if (local_68._0_4_ < 0xd) {
      __dest = local_68 + 4;
    }
    if (0 < right && bVar4) {
      lVar3 = right_00 + (right_00 == 0);
      do {
        switchD_015ff80e::default(__dest,__src,uVar2);
        __dest = __dest + uVar2;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    uVar2 = (ulong)(uint)local_68._0_4_;
    if (uVar2 < 0xd) {
      switchD_0105b559::default(local_68 + 4 + uVar2,0,0xc - uVar2);
    }
    else {
      local_68._4_4_ = *(undefined4 *)local_68._8_8_;
    }
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_68;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = local_58;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "Cannot create a string of size: \'%d\' * \'%d\', the maximum supported string size is: \'%d\'"
             ,"");
  OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long,unsigned_long>
            (this,(string *)local_68,uVar2,right_00,0xffffffff);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}